

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.h
# Opt level: O0

void icu_63::UnifiedCache::getByLocale<icu_63::SharedDateFormatSymbols>
               (Locale *loc,SharedDateFormatSymbols **ptr,UErrorCode *status)

{
  UnifiedCache *this;
  UBool UVar1;
  LocaleCacheKey<icu_63::SharedDateFormatSymbols> local_118;
  UnifiedCache *local_28;
  UnifiedCache *cache;
  UErrorCode *status_local;
  SharedDateFormatSymbols **ptr_local;
  Locale *loc_local;
  
  cache = (UnifiedCache *)status;
  status_local = (UErrorCode *)ptr;
  ptr_local = (SharedDateFormatSymbols **)loc;
  local_28 = getInstance(status);
  UVar1 = ::U_FAILURE(*(UErrorCode *)&(cache->super_UnifiedCacheBase).super_UObject._vptr_UObject);
  this = local_28;
  if (UVar1 == '\0') {
    LocaleCacheKey<icu_63::SharedDateFormatSymbols>::LocaleCacheKey(&local_118,(Locale *)ptr_local);
    get<icu_63::SharedDateFormatSymbols>
              (this,&local_118.super_CacheKey<icu_63::SharedDateFormatSymbols>,
               (SharedDateFormatSymbols **)status_local,(UErrorCode *)cache);
    LocaleCacheKey<icu_63::SharedDateFormatSymbols>::~LocaleCacheKey(&local_118);
  }
  return;
}

Assistant:

static void getByLocale(
           const Locale &loc, const T *&ptr, UErrorCode &status) {
       const UnifiedCache *cache = getInstance(status);
       if (U_FAILURE(status)) {
           return;
       }
       cache->get(LocaleCacheKey<T>(loc), ptr, status);
   }